

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

int VP8GetCostLuma4(VP8EncIterator *it,int16_t *levels)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  VP8Residual res;
  VP8Residual local_40;
  
  pVVar2 = it->enc;
  local_40.coeff_type = 3;
  local_40.prob = (pVVar2->proba).coeffs[3];
  local_40.stats = (pVVar2->proba).stats[3];
  local_40.costs = (pVVar2->proba).remapped_costs[3];
  local_40.first = 0;
  iVar3 = it->left_nz[it->i4 >> 2];
  iVar1 = it->top_nz[it->i4 & 3];
  (*VP8SetResidualCoeffs)(levels,&local_40);
  iVar3 = (*VP8GetResidualCost)(iVar3 + iVar1,&local_40);
  return iVar3;
}

Assistant:

int VP8GetCostLuma4(VP8EncIterator* const it, const int16_t levels[16]) {
  const int x = (it->i4 & 3), y = (it->i4 >> 2);
  VP8Residual res;
  VP8Encoder* const enc = it->enc;
  int R = 0;
  int ctx;

  VP8InitResidual(0, 3, enc, &res);
  ctx = it->top_nz[x] + it->left_nz[y];
  VP8SetResidualCoeffs(levels, &res);
  R += VP8GetResidualCost(ctx, &res);
  return R;
}